

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTParsePacket.cpp
# Opt level: O0

bool readFile(char *path,uint8 **buffer,size_t *size)

{
  int iVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  long lVar4;
  uint8 *puVar5;
  size_t sVar6;
  int r;
  ScopeFile local_30;
  ScopeFile f;
  size_t *size_local;
  uint8 **buffer_local;
  char *path_local;
  
  f.f = (FILE *)size;
  ScopeFile::ScopeFile(&local_30,path);
  pFVar2 = ScopeFile::operator_cast_to__IO_FILE_(&local_30);
  if (pFVar2 == (FILE *)0x0) {
    path_local._7_1_ = false;
  }
  else {
    pFVar3 = (FILE *)ScopeFile::operator_cast_to__IO_FILE_(&local_30);
    iVar1 = fseek(pFVar3,0,2);
    if (iVar1 == 0) {
      pFVar3 = (FILE *)ScopeFile::operator_cast_to__IO_FILE_(&local_30);
      lVar4 = ftell(pFVar3);
      *(long *)f.f = lVar4;
      pFVar3 = (FILE *)ScopeFile::operator_cast_to__IO_FILE_(&local_30);
      iVar1 = fseek(pFVar3,0,0);
      if (iVar1 == 0) {
        if ((*(long *)f.f == 0) || (0x200000 < *(ulong *)f.f)) {
          path_local._7_1_ = false;
        }
        else {
          puVar5 = (uint8 *)operator_new__(*(long *)f.f + 1);
          *buffer = puVar5;
          if (*buffer == (uint8 *)0x0) {
            path_local._7_1_ = false;
          }
          else {
            puVar5 = *buffer;
            sVar6 = *(size_t *)f.f;
            pFVar3 = (FILE *)ScopeFile::operator_cast_to__IO_FILE_(&local_30);
            sVar6 = fread(puVar5,1,sVar6,pFVar3);
            path_local._7_1_ = (long)(int)sVar6 == *(long *)f.f;
          }
        }
      }
      else {
        path_local._7_1_ = false;
      }
    }
    else {
      path_local._7_1_ = false;
    }
  }
  ScopeFile::~ScopeFile(&local_30);
  return path_local._7_1_;
}

Assistant:

bool readFile(const char * path, uint8 *& buffer, size_t & size)
{
    ScopeFile f(path);
    if (!f) return false;
    if (fseek(f, 0,  SEEK_END)) return false;
    size = (size_t)ftell(f);
    if (fseek(f, 0, SEEK_SET)) return false;

    if (!size || size > 2048*1024) return false;
    buffer = new uint8[size+1];
    if (!buffer) return false;

    int r = fread(buffer, 1, size, f);
    return r == size;
}